

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int iVar4;
  PoolAllocator *pPVar5;
  uint uVar6;
  Net *this_00;
  bool bVar7;
  ModelBinFromDataReader mb;
  Option opt1;
  int local_8c;
  ModelBinFromDataReader local_80;
  Option local_70;
  
  ppLVar1 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 == ppLVar2) {
    load_model();
    local_8c = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&local_80,dr);
    uVar6 = (uint)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3);
    if ((int)uVar6 < 1) {
      local_8c = 0;
    }
    else {
      local_8c = 0;
      this_00 = (Net *)0x0;
      do {
        pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)this_00];
        if (pLVar3 == (Layer *)0x0) {
          load_model(this_00);
LAB_001370e6:
          local_8c = -1;
          bVar7 = true;
        }
        else {
          iVar4 = (*pLVar3->_vptr_Layer[3])(pLVar3,&local_80);
          if (iVar4 != 0) {
            load_model();
            goto LAB_001370e6;
          }
          get_masked_option(&local_70,&this->opt,pLVar3->featmask);
          iVar4 = (*pLVar3->_vptr_Layer[4])(pLVar3,&local_70);
          bVar7 = iVar4 != 0;
          if (bVar7) {
            load_model();
            local_8c = -1;
          }
        }
      } while ((!bVar7) &&
              (bVar7 = (Net *)((ulong)(uVar6 & 0x7fffffff) - 1) != this_00,
              this_00 = (Net *)((long)&this_00->_vptr_Net + 1), bVar7));
    }
    if ((this->opt).use_local_pool_allocator == true) {
      if (((this->opt).blob_allocator == (Allocator *)0x0) &&
         (this->d->local_blob_allocator == (PoolAllocator *)0x0)) {
        pPVar5 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar5);
        this->d->local_blob_allocator = pPVar5;
        PoolAllocator::set_size_compare_ratio(pPVar5,0.0);
      }
      if (((this->opt).workspace_allocator == (Allocator *)0x0) &&
         (this->d->local_workspace_allocator == (PoolAllocator *)0x0)) {
        pPVar5 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar5);
        this->d->local_workspace_allocator = pPVar5;
        PoolAllocator::set_size_compare_ratio(pPVar5,0.0);
      }
    }
    ModelBinFromDataReader::~ModelBinFromDataReader(&local_80);
  }
  return local_8c;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.f);
            }
        }
    }

#if NCNN_VULKAN
    if (ret == 0 && opt.use_vulkan_compute)
    {
        ret = d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}